

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<double>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,double *v)

{
  bool bVar1;
  value_type_conflict2 *pvVar2;
  optional<double> local_80;
  undefined1 local_70 [8];
  optional<double> pv_1;
  optional<double> local_58;
  undefined1 local_48 [8];
  optional<double> pv;
  double *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (double *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_004da989;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv.contained,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv.contained);
  if (bVar1) {
    get_default_value<double>(&local_58,this);
    nonstd::optional_lite::optional<double>::optional<double,_0>
              ((optional<double> *)local_48,&local_58);
    nonstd::optional_lite::optional<double>::~optional(&local_58);
    pv_1.contained._4_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_48);
    if ((bool)pv_1.contained._4_1_) {
      pvVar2 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_48);
      *v = *pvVar2;
      this_local._7_1_ = 1;
    }
    pv_1.contained._5_3_ = 0;
    nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_48);
    if (pv_1.contained._4_4_ != 0) goto LAB_004da989;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_004da989;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ = tinyusdz::value::TimeSamples::get<double,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<double>(&local_80,this);
      nonstd::optional_lite::optional<double>::optional<double,_0>
                ((optional<double> *)local_70,&local_80);
      nonstd::optional_lite::optional<double>::~optional(&local_80);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_70);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<double>::value((optional<double> *)local_70);
        *v = *pvVar2;
        this_local._7_1_ = 1;
      }
      pv_1.contained._5_3_ = 0;
      pv_1.contained._4_1_ = bVar1;
      nonstd::optional_lite::optional<double>::~optional((optional<double> *)local_70);
      if (pv_1.contained._4_4_ != 0) goto LAB_004da989;
    }
    this_local._7_1_ = 0;
  }
LAB_004da989:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }